

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

bool __thiscall Company::isEnoughBudget(Company *this)

{
  int iVar1;
  double dVar2;
  int local_1c;
  int local_18;
  int j;
  int sum;
  bool flag;
  Company *this_local;
  
  local_18 = 0;
  for (local_1c = 0; iVar1 = Boss::getNumberOfEmployee(this->boss), local_1c < iVar1;
      local_1c = local_1c + 1) {
    dVar2 = Employee::calculateSalary(this->employee[local_1c]);
    local_18 = (int)((double)local_18 + dVar2);
  }
  return local_18 <= this->budget;
}

Assistant:

bool Company::isEnoughBudget() {

    bool flag = false;
    int sum = 0;
    for (int j = 0; j < boss->getNumberOfEmployee(); j++) {
        sum += employee[j]->calculateSalary();
    }
    if(sum <= budget)
        flag = true;
    return flag;
}